

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# table_function.cpp
# Opt level: O0

bool __thiscall duckdb::TableFunction::Equal(TableFunction *this,TableFunction *rhs)

{
  bool bVar1;
  size_type sVar2;
  size_type sVar3;
  long in_RSI;
  long in_RDI;
  idx_t i;
  LogicalType *in_stack_ffffffffffffffb8;
  const_reference in_stack_ffffffffffffffc0;
  ulong local_20;
  bool local_1;
  
  sVar2 = ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::size
                    ((vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_> *)
                     (in_RDI + 0x48));
  sVar3 = ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::size
                    ((vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_> *)
                     (in_RSI + 0x48));
  if (sVar2 == sVar3) {
    for (local_20 = 0;
        sVar2 = ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::size
                          ((vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_> *)
                           (in_RDI + 0x48)), local_20 < sVar2; local_20 = local_20 + 1) {
      in_stack_ffffffffffffffc0 =
           vector<duckdb::LogicalType,_true>::operator[]
                     ((vector<duckdb::LogicalType,_true> *)in_stack_ffffffffffffffc0,
                      (size_type)in_stack_ffffffffffffffb8);
      vector<duckdb::LogicalType,_true>::operator[]
                ((vector<duckdb::LogicalType,_true> *)in_stack_ffffffffffffffc0,
                 (size_type)in_stack_ffffffffffffffb8);
      bVar1 = LogicalType::operator!=(in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8);
      if (bVar1) {
        return false;
      }
    }
    bVar1 = LogicalType::operator!=(in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8);
    if (bVar1) {
      local_1 = false;
    }
    else {
      local_1 = true;
    }
  }
  else {
    local_1 = false;
  }
  return local_1;
}

Assistant:

bool TableFunction::Equal(const TableFunction &rhs) const {
	// number of types
	if (this->arguments.size() != rhs.arguments.size()) {
		return false;
	}
	// argument types
	for (idx_t i = 0; i < this->arguments.size(); ++i) {
		if (this->arguments[i] != rhs.arguments[i]) {
			return false;
		}
	}
	// varargs
	if (this->varargs != rhs.varargs) {
		return false;
	}

	return true; // they are equal
}